

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

int cmd_ln_free_r(cmd_ln_t *cmdln)

{
  int iVar1;
  int iVar2;
  glist_t g;
  int32 i;
  ulong uVar3;
  gnode_s *pgVar4;
  int32 n;
  int32 local_1c;
  
  iVar2 = 0;
  if (cmdln != (cmd_ln_t *)0x0) {
    iVar1 = cmdln->refcount;
    iVar2 = iVar1 + -1;
    cmdln->refcount = iVar2;
    if (iVar1 < 2) {
      if (cmdln->ht != (hash_table_t *)0x0) {
        g = hash_table_tolist(cmdln->ht,&local_1c);
        for (pgVar4 = g; pgVar4 != (glist_t)0x0; pgVar4 = pgVar4->next) {
          cmd_ln_val_free(*(cmd_ln_val_t **)((pgVar4->data).i + 0x10));
        }
        glist_free(g);
        hash_table_free(cmdln->ht);
        cmdln->ht = (hash_table_t *)0x0;
      }
      if (cmdln->f_argv != (char **)0x0) {
        for (uVar3 = 0; uVar3 < cmdln->f_argc; uVar3 = uVar3 + 1) {
          ckd_free(cmdln->f_argv[uVar3]);
        }
        ckd_free(cmdln->f_argv);
        cmdln->f_argv = (char **)0x0;
        cmdln->f_argc = 0;
      }
      ckd_free(cmdln);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
cmd_ln_free_r(cmd_ln_t *cmdln)
{
    if (cmdln == NULL)
        return 0;
    if (--cmdln->refcount > 0)
        return cmdln->refcount;

    if (cmdln->ht) {
        glist_t entries;
        gnode_t *gn;
        int32 n;

        entries = hash_table_tolist(cmdln->ht, &n);
        for (gn = entries; gn; gn = gnode_next(gn)) {
            hash_entry_t *e = (hash_entry_t *)gnode_ptr(gn);
            cmd_ln_val_free((cmd_ln_val_t *)e->val);
        }
        glist_free(entries);
        hash_table_free(cmdln->ht);
        cmdln->ht = NULL;
    }

    if (cmdln->f_argv) {
        int32 i;
        for (i = 0; i < cmdln->f_argc; ++i) {
            ckd_free(cmdln->f_argv[i]);
        }
        ckd_free(cmdln->f_argv);
        cmdln->f_argv = NULL;
        cmdln->f_argc = 0;
    }
    ckd_free(cmdln);
    return 0;
}